

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFront.c
# Opt level: O2

void Gia_ManFrontTest(Gia_Man_t *p)

{
  int iVar1;
  Gia_Man_t *p_00;
  char *__s;
  
  p_00 = Gia_ManFront(p);
  Gia_ManFrontTransform(p_00);
  iVar1 = bcmp(p_00->pObjs,p->pObjs,(long)p->nObjs * 0xc);
  __s = "Verification failed.";
  if (iVar1 == 0) {
    __s = "Verification successful.";
  }
  puts(__s);
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Gia_ManFrontTest( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    pNew  = Gia_ManFront( p );
    Gia_ManFrontTransform( pNew );
//    Gia_ManCleanValue( p );
//    Gia_ManCleanValue( pNew );
    if ( memcmp( pNew->pObjs, p->pObjs, sizeof(Gia_Obj_t) * p->nObjs ) )
    {
/*
        Gia_Obj_t * pObj, * pObjNew;
        int i;
        Gia_ManForEachObj( p, pObj, i )
        {
            pObjNew = Gia_ManObj( pNew, i );
            printf( "%5d %5d   %5d %5d\n", 
                pObj->iDiff0, pObjNew->iDiff0, 
                pObj->iDiff1, pObjNew->iDiff1 );
        }
*/
        printf( "Verification failed.\n" );
    }
    else
        printf( "Verification successful.\n" );
    Gia_ManStop( pNew );
}